

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_behavior(archive *_a,wchar_t flags)

{
  int iVar1;
  wchar_t local_2c;
  wchar_t magic_test;
  wchar_t r;
  archive_read_disk *a;
  wchar_t flags_local;
  archive *_a_local;
  
  local_2c = L'\0';
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_honor_nodump");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if ((flags & 1U) == 0) {
      _a[1].file_count = 0;
      if (*(long *)&_a[1].archive_format != 0) {
        *(uint *)(*(long *)&_a[1].archive_format + 0x30) =
             *(uint *)(*(long *)&_a[1].archive_format + 0x30) & 0xffffff7f;
      }
    }
    else {
      local_2c = archive_read_disk_set_atime_restored(_a);
    }
    if ((flags & 2U) == 0) {
      _a[1].archive_error_number = 0;
    }
    else {
      _a[1].archive_error_number = 1;
    }
    if ((flags & 4U) == 0) {
      *(undefined4 *)&_a[1].error = 0;
    }
    else {
      *(undefined4 *)&_a[1].error = 1;
    }
    if ((flags & 8U) == 0) {
      *(undefined4 *)((long)&_a[1].error + 4) = 1;
    }
    else {
      *(undefined4 *)((long)&_a[1].error + 4) = 0;
    }
    if ((flags & 0x10U) == 0) {
      *(undefined4 *)&_a[1].error_string.s = 0;
    }
    else {
      *(undefined4 *)&_a[1].error_string.s = 1;
    }
    _a_local._4_4_ = local_2c;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_set_behavior(struct archive *_a, int flags)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	int r = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_honor_nodump");

	if (flags & ARCHIVE_READDISK_RESTORE_ATIME)
		r = archive_read_disk_set_atime_restored(_a);
	else {
		a->restore_time = 0;
		if (a->tree != NULL)
			a->tree->flags &= ~needsRestoreTimes;
	}
	if (flags & ARCHIVE_READDISK_HONOR_NODUMP)
		a->honor_nodump = 1;
	else
		a->honor_nodump = 0;
	if (flags & ARCHIVE_READDISK_MAC_COPYFILE)
		a->enable_copyfile = 1;
	else
		a->enable_copyfile = 0;
	if (flags & ARCHIVE_READDISK_NO_TRAVERSE_MOUNTS)
		a->traverse_mount_points = 0;
	else
		a->traverse_mount_points = 1;
	if (flags & ARCHIVE_READDISK_NO_XATTR)
		a->suppress_xattr = 1;
	else
		a->suppress_xattr = 0;
	return (r);
}